

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  int iVar6;
  charcount_t cchUseLength;
  charcount_t cVar7;
  undefined4 *puVar8;
  Var pvVar9;
  DynamicObject *stateObject;
  void **resource;
  FinalizableICUObject<void_**,_&unum_close_70> *pFVar10;
  Recycler *pRVar11;
  char *pcVar12;
  Recycler *pRVar13;
  LPCSTR pCVar14;
  char16 *content;
  JavascriptString *pJVar15;
  char *error;
  uint uVar16;
  size_t sVar17;
  uint in_stack_00000010;
  undefined1 local_128 [8];
  char localeID [157];
  FinalizableICUObject<void_**,_&unum_close_70> *local_80;
  Var cachedUNumberFormat;
  FinalizableUPluralRules *local_70;
  undefined1 local_68 [8];
  Arguments args;
  int local_44;
  FinalizableICUObject<void_**,_&unum_close_70> *pFStack_40;
  UErrorCode status;
  int local_34 [2];
  UErrorCode status_1;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar16 = callInfo._0_4_;
  if (in_stack_00000010 != uVar16) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])callInfo;
  if ((uVar16 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar16 & 0xffffff) == 3) {
    pvVar9 = Arguments::operator[]((Arguments *)local_68,1);
    bVar3 = DynamicObject::IsBaseDynamicObject(pvVar9);
    if (!bVar3) goto LAB_00b580cd;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xbe2,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00b58ef5;
      *puVar8 = 0;
    }
LAB_00b580cd:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe3,
                                "((args.Info.Count == 3 && DynamicObject::IsBaseDynamicObject(args[1])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  pvVar9 = Arguments::operator[]((Arguments *)local_68,1);
  stateObject = UnsafeVarTo<Js::DynamicObject>(pvVar9);
  pvVar9 = Arguments::operator[]((Arguments *)local_68,2);
  if (((ulong)pvVar9 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar9 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar9 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b581d9;
    pvVar9 = Arguments::operator[]((Arguments *)local_68,2);
    if ((ulong)pvVar9 >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xbed,"(JavascriptNumber::Is(args[2]))",
                                  "JavascriptNumber::Is(args[2])");
      if (!bVar3) goto LAB_00b58ef5;
      *puVar8 = 0;
    }
    pvVar9 = Arguments::operator[]((Arguments *)local_68,2);
    if (pvVar9 < (Var)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00b58ef5;
      *puVar8 = 0;
    }
    args.Values = (Type)((ulong)pvVar9 ^ 0xfffc000000000000);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
LAB_00b581d9:
    pvVar9 = Arguments::operator[]((Arguments *)local_68,2);
    args.Values = (Type)(double)(int)pvVar9;
  }
  Output::Trace(IntlPhase,L"%S(): Calling PluralRules.prototype.select(%f)\n",
                "EntryIntl_PluralRulesSelect");
  local_44 = 0;
  local_70 = GetOrCreateCachedUPluralRules(stateObject,pSVar1);
  local_80 = (FinalizableICUObject<void_**,_&unum_close_70> *)0x0;
  iVar4 = (*(stateObject->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (stateObject,stateObject,10,&local_80,0,pSVar1);
  if (iVar4 == 0) {
    memset((char (*) [157])local_128,0,0x9d);
    pJVar15 = AssertStringProperty(stateObject,(PropertyIds)0x20d);
    LangtagToLocaleID<157ul>(pJVar15,(char (*) [157])local_128);
    pRVar13 = pSVar1->recycler;
    resource = (void **)unum_open_70(1,0,0,(char (*) [157])local_128,0,&local_44);
    pFVar10 = FinalizableICUObject<void_**,_&unum_close_70>::New(pRVar13,resource);
    SetUNumberFormatDigitOptions(pFVar10->resource,stateObject);
    Output::Trace(IntlPhase,L"%S(): Caching UNumberFormat object (0x%x) with localeID %S\n",
                  "EntryIntl_PluralRulesSelect",pFVar10,(char (*) [157])local_128);
    pFStack_40 = pFVar10;
    (*(stateObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x19])(stateObject,10,pFVar10,0,0);
  }
  else {
    pFStack_40 = local_80;
    Output::Trace(IntlPhase,L"%S(): Using previously cached UNumberFormat (0x%x)\n",
                  "EntryIntl_PluralRulesSelect");
  }
  pRVar13 = pSVar1->recycler;
  local_34[0] = 0;
  local_128 = (undefined1  [8])&char16_t::typeinfo;
  localeID[0] = '\0';
  localeID[1] = '\0';
  localeID[2] = '\0';
  localeID[3] = '\0';
  localeID[4] = '\0';
  localeID[5] = '\0';
  localeID[6] = '\0';
  localeID[7] = '\0';
  localeID[8] = '\b';
  localeID[9] = '\0';
  localeID[10] = '\0';
  localeID[0xb] = '\0';
  localeID[0xc] = '\0';
  localeID[0xd] = '\0';
  localeID[0xe] = '\0';
  localeID[0xf] = '\0';
  localeID._16_8_ = anon_var_dwarf_66fc5bd;
  localeID[0x18] = 'Y';
  localeID[0x19] = '\x01';
  localeID[0x1a] = '\0';
  localeID[0x1b] = '\0';
  pRVar11 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_128);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  pcVar12 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (pRVar11,0x10);
  pFVar10 = pFStack_40;
  if (pcVar12 == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  iVar4 = unum_formatDouble_70(args.Values,pFVar10->resource,pcVar12,8,0,local_34);
  if (iVar4 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  if ((local_34[0] == 0xf) || (local_34[0] == -0x7c)) {
    if (iVar4 < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar3) goto LAB_00b58ef5;
      *puVar8 = 0;
    }
    uVar16 = iVar4 + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar16);
    local_34[0] = 0;
    local_128 = (undefined1  [8])&char16_t::typeinfo;
    localeID[0] = '\0';
    localeID[1] = '\0';
    localeID[2] = '\0';
    localeID[3] = '\0';
    localeID[4] = '\0';
    localeID[5] = '\0';
    localeID[6] = '\0';
    localeID[7] = '\0';
    localeID._16_8_ = anon_var_dwarf_66fc5bd;
    localeID[0x18] = 'b';
    localeID[0x19] = '\x01';
    localeID[0x1a] = '\0';
    localeID[0x1b] = '\0';
    localeID._8_8_ = (long)(int)uVar16;
    pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_128);
    if (iVar4 == -1) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar13,(TrackAllocData *)0x0);
      pcVar12 = &DAT_00000008;
      pFVar10 = pFStack_40;
    }
    else {
      sVar17 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        sVar17 = (long)(int)uVar16 * 2;
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      pFVar10 = pFStack_40;
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        cachedUNumberFormat = (Var)__tls_get_addr(&PTR_01548f08);
        *(undefined4 *)cachedUNumberFormat = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00b58ef5;
        *(undefined4 *)cachedUNumberFormat = 0;
      }
      pcVar12 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar13,sVar17);
      if (pcVar12 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00b58ef5;
        *puVar8 = 0;
        pcVar12 = (char *)0x0;
      }
    }
    iVar6 = unum_formatDouble_70(args.Values,pFVar10->resource,pcVar12,uVar16,0,local_34);
    if (iVar6 != iVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      iVar4 = iVar6;
      goto joined_r0x00b5883d;
    }
  }
  else if (7 < iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00b5883d:
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  if (0 < local_34[0] || local_34[0] == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pCVar14 = (LPCSTR)u_errorName_70(local_34[0]);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar14);
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  pFStack_40 = (FinalizableICUObject<void_**,_&unum_close_70> *)
               unum_parseDouble_70(pFVar10->resource,pcVar12,iVar4,0,&local_44);
  if (local_44 == 7) {
    Throw::OutOfMemory();
  }
  if (local_44 < 1 && local_44 != -0x7c) {
    if ((((((((double)args.Values <= 0.0) || ((double)args.Values < (double)pFStack_40)) ||
           ((double)pFStack_40 < 0.0)) &&
          (((0.0 <= (double)args.Values || ((double)pFStack_40 < (double)args.Values)) ||
           (0.0 < (double)pFStack_40)))) &&
         ((((double)args.Values != 0.0 || (NAN((double)args.Values))) ||
          (((double)pFStack_40 != 0.0 || (NAN((double)pFStack_40))))))) &&
        ((((double)args.Values <= 0.0 || ((double)args.Values < (double)pFStack_40)) ||
         ((double)pFStack_40 < 0.0)))) &&
       (((0.0 <= (double)args.Values || ((double)pFStack_40 < (double)args.Values)) ||
        (0.0 < (double)pFStack_40)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      error = 
      "((n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) || (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) || (n == 0.0 && nWithOptions == 0))"
      ;
      pcVar12 = 
      "(n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) || (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) || (n == 0.0 && nWithOptions == 0)"
      ;
      goto LAB_00b5893f;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar12 = (char *)u_errorName_70(local_44);
    error = "(false)";
LAB_00b5893f:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xc1d,error,pcVar12);
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  pRVar13 = pSVar1->recycler;
  local_34[0] = 0;
  local_128 = (undefined1  [8])&char16_t::typeinfo;
  localeID[0] = '\0';
  localeID[1] = '\0';
  localeID[2] = '\0';
  localeID[3] = '\0';
  localeID[4] = '\0';
  localeID[5] = '\0';
  localeID[6] = '\0';
  localeID[7] = '\0';
  localeID[8] = '\b';
  localeID[9] = '\0';
  localeID[10] = '\0';
  localeID[0xb] = '\0';
  localeID[0xc] = '\0';
  localeID[0xd] = '\0';
  localeID[0xe] = '\0';
  localeID[0xf] = '\0';
  localeID._16_8_ = anon_var_dwarf_66fc5bd;
  localeID[0x18] = 'Y';
  localeID[0x19] = '\x01';
  localeID[0x1a] = '\0';
  localeID[0x1b] = '\0';
  pRVar11 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_128);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  content = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (pRVar11,0x10);
  if (content == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  cchUseLength = uplrules_select_70(pFStack_40,local_70->resource,content,8,local_34);
  if ((int)cchUseLength < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  if ((local_34[0] == 0xf) || (local_34[0] == -0x7c)) {
    if ((int)cchUseLength < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar3) goto LAB_00b58ef5;
      *puVar8 = 0;
    }
    uVar16 = cchUseLength + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar16);
    local_34[0] = 0;
    local_128 = (undefined1  [8])&char16_t::typeinfo;
    localeID[0] = '\0';
    localeID[1] = '\0';
    localeID[2] = '\0';
    localeID[3] = '\0';
    localeID[4] = '\0';
    localeID[5] = '\0';
    localeID[6] = '\0';
    localeID[7] = '\0';
    localeID._16_8_ = anon_var_dwarf_66fc5bd;
    localeID[0x18] = 'b';
    localeID[0x19] = '\x01';
    localeID[0x1a] = '\0';
    localeID[0x1b] = '\0';
    localeID._8_8_ = (long)(int)uVar16;
    pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_128);
    if (cchUseLength == 0xffffffff) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar13,(TrackAllocData *)0x0);
      content = (char16 *)&DAT_00000008;
    }
    else {
      sVar17 = 0xffffffffffffffff;
      if (-1 < (int)uVar16) {
        sVar17 = (long)(int)uVar16 * 2;
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00b58ef5;
        *puVar8 = 0;
      }
      content = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar13,sVar17);
      if (content == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00b58ef5;
        *puVar8 = 0;
        content = (char16 *)0x0;
      }
    }
    cVar7 = uplrules_select_70(pFStack_40,local_70->resource,content,uVar16,local_34);
    if (cVar7 != cchUseLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      cchUseLength = cVar7;
      goto joined_r0x00b58e60;
    }
  }
  else if (7 < (int)cchUseLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00b58e60:
    if (!bVar3) goto LAB_00b58ef5;
    *puVar8 = 0;
  }
  if (0 < local_34[0] || local_34[0] == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pCVar14 = (LPCSTR)u_errorName_70(local_34[0]);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar14);
    if (!bVar3) {
LAB_00b58ef5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pJVar15 = JavascriptString::NewWithBuffer(content,cchUseLength,pSVar1);
  return pJVar15;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect(RecyclableObject *function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 3 && DynamicObject::IsBaseDynamicObject(args[1]));

        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[1]);
        double n = 0.0;
        if (TaggedInt::Is(args[2]))
        {
            n = TaggedInt::ToDouble(args[2]);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(args[2]));
            n = JavascriptNumber::GetValue(args[2]);
        }

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(PluralRules_Prototype_select);
        INTL_TRACE("Calling PluralRules.prototype.select(%f)", n);

        UErrorCode status = U_ZERO_ERROR;

        FinalizableUPluralRules *pr = GetOrCreateCachedUPluralRules(state, scriptContext);

        // ICU has an internal API, uplrules_selectWithFormat, that is equivalent to uplrules_select but will respect digit options of the passed UNumberFormat.
        // Since its an internal API, we can't use it -- however, we can work around it by creating a UNumberFormat with provided digit options,
        // formatting the requested number to a string, and then converting the string back to a double which we can pass to uplrules_select.
        // This workaround was suggested during the May 2018 ECMA-402 discussion.
        // The below is similar to GetOrCreateCachedUPluralRules, but since creating a UNumberFormat for Intl.NumberFormat is much more involved and no one else
        // uses this functionality, it makes more sense to me to just put the logic inline.
        Var cachedUNumberFormat = nullptr;
        FinalizableUNumberFormat *nf = nullptr;
        if (state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, nullptr, scriptContext))
        {
            nf = reinterpret_cast<FinalizableUNumberFormat *>(cachedUNumberFormat);
            INTL_TRACE("Using previously cached UNumberFormat (0x%x)", nf);
        }
        else
        {
            char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
            LangtagToLocaleID(AssertStringProperty(state, PropertyIds::locale), localeID);
            nf = FinalizableUNumberFormat::New(scriptContext->GetRecycler(), unum_open(UNUM_DECIMAL, nullptr, 0, localeID, nullptr, &status));

            SetUNumberFormatDigitOptions(*nf, state);

            INTL_TRACE("Caching UNumberFormat object (0x%x) with localeID %S", nf, localeID);

            state->SetInternalProperty(InternalPropertyIds::CachedUNumberFormat, nf, PropertyOperationFlags::PropertyOperation_None, nullptr);
        }

        char16 *formattedN = nullptr;
        int formattedNLength = 0;
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDouble(*nf, n, buf, bufLen, nullptr, status);
        }, scriptContext->GetRecycler(), &formattedN, &formattedNLength);

        double nWithOptions = unum_parseDouble(*nf, reinterpret_cast<UChar *>(formattedN), formattedNLength, nullptr, &status);

        ICU_ASSERT(status, (n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) ||
            (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) ||
            (n == 0.0 && nWithOptions == 0));

        char16 *selected = nullptr;
        int selectedLength = 0;
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return uplrules_select(*pr, nWithOptions, buf, bufLen, status);
        }, scriptContext->GetRecycler(), &selected, &selectedLength);

        return JavascriptString::NewWithBuffer(selected, static_cast<charcount_t>(selectedLength), scriptContext);
#else
        AssertOrFailFastMsg(false, "Intl-WinGlob should not be using PluralRulesSelect");
        return nullptr;
#endif
    }